

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlocale.cpp
# Opt level: O0

bool comparesEqual(QLocale *loc,Language lang)

{
  long lVar1;
  bool bVar2;
  QLocaleData *data_00;
  QLocaleData *pQVar3;
  short in_SI;
  long in_FS_OFFSET;
  QLocaleData *data;
  qsizetype index;
  NumberOptions numberOptions;
  anon_class_8_1_ba1d5ea0 compareWithPrivate;
  NumberOption in_stack_ffffffffffffff9c;
  QSharedDataPointer<QLocalePrivate> *in_stack_ffffffffffffffa0;
  QLocaleData *in_stack_ffffffffffffffb0;
  undefined6 in_stack_ffffffffffffffb8;
  QFlagsStorage<QLocale::NumberOption> in_stack_ffffffffffffffcc;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (in_SI == 1) {
    c_private();
    c_private();
    bVar2 = comparesEqual::anon_class_8_1_ba1d5ea0::operator()
                      ((anon_class_8_1_ba1d5ea0 *)CONCAT26(in_SI,in_stack_ffffffffffffffb8),
                       in_stack_ffffffffffffffb0,(NumberOptions)in_stack_ffffffffffffffcc.i);
  }
  else {
    data_00 = (QLocaleData *)QLocaleData::findLocaleIndex(compareWithPrivate.loc._2_6_);
    pQVar3 = locale_data + (long)data_00;
    QFlags<QLocale::NumberOption>::QFlags
              ((QFlags<QLocale::NumberOption> *)in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c)
    ;
    if (pQVar3->m_language_id == 1) {
      bVar2 = QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_defaultLocalePrivate>_>
              ::exists((QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_defaultLocalePrivate>_>
                        *)0x4c8813);
      if (bVar2) {
        QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_defaultLocalePrivate>_>::
        operator->((QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_defaultLocalePrivate>_>
                    *)0x4c8825);
        QSharedDataPointer<QLocalePrivate>::data(in_stack_ffffffffffffffa0);
      }
      defaultData();
    }
    bVar2 = comparesEqual::anon_class_8_1_ba1d5ea0::operator()
                      ((anon_class_8_1_ba1d5ea0 *)CONCAT26(in_SI,in_stack_ffffffffffffffb8),data_00,
                       (NumberOptions)in_stack_ffffffffffffffcc.i);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return bVar2;
}

Assistant:

bool comparesEqual(const QLocale &loc, QLocale::Language lang)
{
    // Keep in sync with findLocalePrivate()!
    auto compareWithPrivate = [&loc](const QLocaleData *data, QLocale::NumberOptions opts)
    {
        return loc.d->m_data == data && loc.d->m_numberOptions == opts;
    };

    if (lang == QLocale::C)
        return compareWithPrivate(c_private()->m_data, c_private()->m_numberOptions);

    qsizetype index = QLocaleData::findLocaleIndex(QLocaleId { lang });
    Q_ASSERT(index >= 0 && index < locale_data_size);
    const QLocaleData *data = locale_data + index;

    QLocale::NumberOptions numberOptions = QLocale::DefaultNumberOptions;

    // If not found, should use default locale:
    if (data->m_language_id == QLocale::C) {
        if (defaultLocalePrivate.exists())
            numberOptions = defaultLocalePrivate->data()->m_numberOptions;
        data = defaultData();
    }
    return compareWithPrivate(data, numberOptions);
}